

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::
Global_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Global_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss)

{
  Boxed_Value *obj;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  Boxed_Value BVar2;
  undefined1 local_48 [48];
  
  lVar1 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
  if (*(int *)(lVar1 + 8) == 0x22) {
    lVar1 = **(long **)(lVar1 + 0x50);
  }
  obj = (Boxed_Value *)*in_RDX;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  Boxed_Value::Object_Data::get();
  std::__cxx11::string::string
            ((string *)(local_48 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + 0x10));
  chaiscript::detail::Dispatch_Engine::add_global_no_throw
            ((Dispatch_Engine *)this,obj,(string *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const std::string &idname = (this->children[0]->identifier == AST_Node_Type::Reference) ? this->children[0]->children[0]->text : this->children[0]->text;

        return t_ss->add_global_no_throw(Boxed_Value(), idname);
      }